

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

bool gl4cts::SparseTextureUtils::verifyQueryError
               (stringstream *log,char *funcName,GLint target,GLint pname,GLint error,
               GLint expectedError)

{
  ostream *poVar1;
  
  if (error != expectedError) {
    poVar1 = std::operator<<((ostream *)(log + 0x10),"QueryError [");
    poVar1 = std::operator<<(poVar1,funcName);
    poVar1 = std::operator<<(poVar1," return wrong error code");
    poVar1 = std::operator<<(poVar1,", target: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,target);
    poVar1 = std::operator<<(poVar1,", pname: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pname);
    poVar1 = std::operator<<(poVar1,", expected: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,expectedError);
    poVar1 = std::operator<<(poVar1,", returned: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,error);
    std::operator<<(poVar1,"] - ");
  }
  return error == expectedError;
}

Assistant:

bool SparseTextureUtils::verifyQueryError(std::stringstream& log, const char* funcName, GLint target, GLint pname,
										  GLint error, GLint expectedError)
{
	if (error != expectedError)
	{
		log << "QueryError [" << funcName << " return wrong error code"
			<< ", target: " << target << ", pname: " << pname << ", expected: " << expectedError
			<< ", returned: " << error << "] - ";

		return false;
	}

	return true;
}